

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O0

void __thiscall
gtest_suite_NoiseModelUpdateTest_::
UpdateFailsBlockSizeTooSmall<BitDepthParams<unsigned_char,_8,_false>_>::
~UpdateFailsBlockSizeTooSmall
          (UpdateFailsBlockSizeTooSmall<BitDepthParams<unsigned_char,_8,_false>_> *this)

{
  void *in_RDI;
  
  ~UpdateFailsBlockSizeTooSmall
            ((UpdateFailsBlockSizeTooSmall<BitDepthParams<unsigned_char,_8,_false>_> *)0x5c80e8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TYPED_TEST_P(NoiseModelUpdateTest, UpdateFailsBlockSizeTooSmall) {
  this->flat_blocks_.assign(this->flat_blocks_.size(), 1);
  this->denoised_.assign(this->denoised_.size(), 128);
  this->data_.assign(this->denoised_.size(), 128);
  EXPECT_EQ(AOM_NOISE_STATUS_INVALID_ARGUMENT,
            this->NoiseModelUpdate(6 /* block_size=6 is too small*/));
}